

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

void ImageResizeNN(Image *image,int newWidth,int newHeight)

{
  int iVar1;
  int iVar2;
  Color *__ptr;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  int x;
  ulong uVar8;
  int iVar9;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    __ptr = LoadImageColors(*image);
    pvVar3 = malloc((long)(newHeight * newWidth) << 2);
    iVar1 = image->width;
    iVar2 = image->height;
    uVar4 = 0;
    uVar5 = 0;
    if (0 < newWidth) {
      uVar5 = (ulong)(uint)newWidth;
    }
    uVar6 = 0;
    if (0 < newHeight) {
      uVar6 = (ulong)(uint)newHeight;
    }
    pvVar7 = pvVar3;
    for (; uVar4 != uVar6; uVar4 = uVar4 + 1) {
      iVar9 = 0;
      for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
        *(Color *)((long)pvVar7 + uVar8 * 4) =
             __ptr[(iVar9 >> 0x10) +
                   (((iVar2 << 0x10) / newHeight + 1) * (int)uVar4 >> 0x10) * iVar1];
        iVar9 = iVar9 + (iVar1 << 0x10) / newWidth + 1;
      }
      pvVar7 = (void *)((long)pvVar7 + (long)newWidth * 4);
    }
    iVar1 = image->format;
    free(image->data);
    image->data = pvVar3;
    image->width = newWidth;
    image->height = newHeight;
    image->format = 7;
    ImageFormat(image,iVar1);
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void ImageResizeNN(Image *image,int newWidth,int newHeight)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    Color *pixels = LoadImageColors(*image);
    Color *output = (Color *)RL_MALLOC(newWidth*newHeight*sizeof(Color));

    // EDIT: added +1 to account for an early rounding problem
    int xRatio = (int)((image->width << 16)/newWidth) + 1;
    int yRatio = (int)((image->height << 16)/newHeight) + 1;

    int x2, y2;
    for (int y = 0; y < newHeight; y++)
    {
        for (int x = 0; x < newWidth; x++)
        {
            x2 = ((x*xRatio) >> 16);
            y2 = ((y*yRatio) >> 16);

            output[(y*newWidth) + x] = pixels[(y2*image->width) + x2] ;
        }
    }

    int format = image->format;

    RL_FREE(image->data);

    image->data = output;
    image->width = newWidth;
    image->height = newHeight;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);  // Reformat 32bit RGBA image to original format

    UnloadImageColors(pixels);
}